

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * __thiscall
FSerializer::Args(FSerializer *this,char *key,int *args,int *defargs,int special)

{
  FWriter *this_00;
  bool bVar1;
  SizeType a;
  int iVar2;
  Ch *cc;
  char *pcVar3;
  FName local_5c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_58;
  Value *aval;
  uint i_1;
  uint cnt;
  Value *val;
  int local_38;
  int local_34;
  int i;
  int special_local;
  int *defargs_local;
  int *args_local;
  char *key_local;
  FSerializer *this_local;
  
  local_34 = special;
  _i = defargs;
  defargs_local = args;
  args_local = (int *)key;
  key_local = (char *)this;
  bVar1 = isWriting(this);
  if (bVar1) {
    bVar1 = FWriter::inObject(this->w);
    if (((!bVar1) || (_i == (int *)0x0)) || (iVar2 = memcmp(defargs_local,_i,0x14), iVar2 != 0)) {
      WriteKey(this,(char *)args_local);
      FWriter::StartArray(this->w);
      for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
        if (((local_38 == 0) && (*defargs_local < 0)) && (bVar1 = P_IsACSSpecial(local_34), bVar1))
        {
          this_00 = this->w;
          FName::FName((FName *)((long)&val + 4),-defargs_local[local_38]);
          pcVar3 = FName::GetChars((FName *)((long)&val + 4));
          FWriter::String(this_00,pcVar3);
        }
        else {
          FWriter::Int(this->w,defargs_local[local_38]);
        }
      }
      FWriter::EndArray(this->w);
    }
  }
  else {
    _i_1 = FReader::FindKey(this->r,(char *)args_local);
    if (_i_1 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsArray(_i_1);
      if (!bVar1) {
        __assert_fail("false && \"array expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x2f5,"FSerializer &FSerializer::Args(const char *, int *, int *, int)");
      }
      a = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(_i_1);
      aval._4_4_ = MIN<unsigned_int>(a,5);
      for (aval._0_4_ = 0; (uint)aval < aval._4_4_; aval._0_4_ = (uint)aval + 1) {
        local_58 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](_i_1,(uint)aval);
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsInt(local_58);
        if (bVar1) {
          iVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(local_58);
          defargs_local[(uint)aval] = iVar2;
        }
        else {
          if (((uint)aval != 0) ||
             (bVar1 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::IsString(local_58), !bVar1)) {
            __assert_fail("false && \"Integer expected\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x2ed,"FSerializer &FSerializer::Args(const char *, int *, int *, int)");
          }
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(local_58);
          pcVar3 = UnicodeToString(cc);
          FName::FName(&local_5c,pcVar3);
          iVar2 = FName::operator_cast_to_int(&local_5c);
          defargs_local[(uint)aval] = -iVar2;
        }
      }
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Args(const char *key, int *args, int *defargs, int special)
{
	if (isWriting())
	{
		if (w->inObject() && defargs != nullptr && !memcmp(args, defargs, 5 * sizeof(int)))
		{
			return *this;
		}

		WriteKey(key);
		w->StartArray();
		for (int i = 0; i < 5; i++)
		{
			if (i == 0 && args[i] < 0 && P_IsACSSpecial(special))
			{
				w->String(FName(ENamedName(-args[i])).GetChars());
			}
			else
			{
				w->Int(args[i]);
			}
		}
		w->EndArray();
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				unsigned int cnt = MIN<unsigned>(val->Size(), 5);
				for (unsigned int i = 0; i < cnt; i++)
				{
					const rapidjson::Value &aval = (*val)[i];
					if (aval.IsInt())
					{
						args[i] = aval.GetInt();
					}
					else if (i == 0 && aval.IsString())
					{
						args[i] = -FName(UnicodeToString(aval.GetString()));
					}
					else
					{
						assert(false && "Integer expected");
						Printf(TEXTCOLOR_RED "Integer expected for '%s[%d]'", key, i);
						mErrors++;
					}
				}
			}
			else
			{
				assert(false && "array expected");
				Printf(TEXTCOLOR_RED "array expected for '%s'", key);
				mErrors++;
			}
		}
	}
	return *this;
}